

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int32_t __thiscall
aeron::archive::AeronArchive::listRecordings
          (AeronArchive *this,int64_t fromRecordingId,int32_t recordCount,
          RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  anon_class_24_3_f4f1ea6f local_60;
  function<bool_(long)> local_48;
  RecordingDescriptorConsumer *local_28;
  RecordingDescriptorConsumer *consumer_local;
  int64_t iStack_18;
  int32_t recordCount_local;
  int64_t fromRecordingId_local;
  AeronArchive *this_local;
  
  local_60.fromRecordingId = &stack0xffffffffffffffe8;
  local_60.recordCount = (int32_t *)((long)&consumer_local + 4);
  local_60.this = this;
  local_28 = consumer;
  consumer_local._4_4_ = recordCount;
  iStack_18 = fromRecordingId;
  fromRecordingId_local = (int64_t)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::listRecordings(long,int,std::function<void(long,long,long,long,long,long,long,int,int,int,int,int,int,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>&&)::__0,void>
            ((function<bool(long)> *)&local_48,&local_60);
  iVar1 = callAndPollForDescriptors(this,&local_48,consumer_local._4_4_,local_28,"list recordings");
  std::function<bool_(long)>::~function(&local_48);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecordings(std::int64_t fromRecordingId, std::int32_t recordCount,
                                          RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecordings(fromRecordingId, recordCount, correlationId, controlSessionId_);
        },
        recordCount, std::move(consumer), "list recordings");
}